

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

int create_send_pending_events_state
              (TELEMETRY_MESSENGER_INSTANCE_conflict *instance,
              SEND_PENDING_EVENTS_STATE *send_pending_events_state)

{
  int iVar1;
  MESSAGE_HANDLE pMVar2;
  LOGGER_LOG p_Var3;
  MESSENGER_SEND_EVENT_TASK *pMVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  SEND_PENDING_EVENTS_STATE *send_pending_events_state_local;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance_local;
  
  memset(send_pending_events_state,0,0x18);
  pMVar2 = message_create();
  send_pending_events_state->message_batch_container = pMVar2;
  if (pMVar2 == (MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"create_send_pending_events_state",0x442,1,
                "messageBatchContainer = message_create() failed");
    }
    l._4_4_ = 0x443;
  }
  else {
    iVar1 = message_set_message_format
                      (send_pending_events_state->message_batch_container,0x80013700);
    if (iVar1 == 0) {
      pMVar4 = create_task(instance);
      send_pending_events_state->task = pMVar4;
      if (pMVar4 == (MESSENGER_SEND_EVENT_TASK *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"create_send_pending_events_state",0x44c,1,"create_task() failed");
        }
        l._4_4_ = 0x44d;
      }
      else {
        l._4_4_ = 0;
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"create_send_pending_events_state",0x447,1,
                  "Failed setting the message format to batching format");
      }
      l._4_4_ = 0x448;
    }
  }
  return l._4_4_;
}

Assistant:

static int create_send_pending_events_state(TELEMETRY_MESSENGER_INSTANCE* instance, SEND_PENDING_EVENTS_STATE *send_pending_events_state)
{
    int result;
    memset(send_pending_events_state, 0, sizeof(*send_pending_events_state));

    if ((send_pending_events_state->message_batch_container = message_create()) == NULL)
    {
        LogError("messageBatchContainer = message_create() failed");
        result = MU_FAILURE;
    }
    else if (message_set_message_format(send_pending_events_state->message_batch_container, AMQP_BATCHING_FORMAT_CODE) != 0)
    {
         LogError("Failed setting the message format to batching format");
         result = MU_FAILURE;
    }
    else if ((send_pending_events_state->task = create_task(instance)) == NULL)
    {
        LogError("create_task() failed");
        result = MU_FAILURE;
    }
    else
    {
        result = RESULT_OK;
    }

    return result;
}